

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsChrpathUsed(cmGeneratorTarget *this,string *config)

{
  TargetType TVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  string ll;
  string sepVar;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  TVar1 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar1) {
    return false;
  }
  if (TVar1 == STATIC_LIBRARY) {
    return false;
  }
  if (this->Target->HaveInstallRule != true) {
    return false;
  }
  pcVar2 = this->Makefile;
  std::__cxx11::string::string((string *)&local_80,"CMAKE_SKIP_RPATH",(allocator *)&local_60);
  bVar3 = cmMakefile::IsOn(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar3) {
    return false;
  }
  std::__cxx11::string::string
            ((string *)&local_80,"BUILD_WITH_INSTALL_RPATH",(allocator *)&local_60);
  bVar3 = GetPropertyAsBool(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar3) {
    return false;
  }
  pcVar2 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&local_80,"CMAKE_NO_BUILTIN_CHRPATH",(allocator *)&local_60);
  bVar3 = cmMakefile::IsOn(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar3) {
    return false;
  }
  pcVar2 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&local_80,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator *)&local_60);
  bVar3 = cmMakefile::IsOn(pcVar2,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  bVar6 = true;
  if (bVar3) {
    return true;
  }
  GetLinkerLanguage(&local_80,this,config);
  if (local_80._M_string_length != 0) {
    std::__cxx11::string::string
              ((string *)&local_60,"CMAKE_SHARED_LIBRARY_RUNTIME_",(allocator *)&local_40);
    std::__cxx11::string::append((string *)&local_60);
    std::__cxx11::string::append((char *)&local_60);
    pcVar5 = cmMakefile::GetDefinition(this->Makefile,&local_60);
    bVar3 = true;
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      pcVar2 = this->Makefile;
      std::__cxx11::string::string((string *)&local_40,"CMAKE_EXECUTABLE_FORMAT",&local_81);
      pcVar5 = cmMakefile::GetDefinition(pcVar2,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (pcVar5 != (char *)0x0) {
        iVar4 = strcmp(pcVar5,"ELF");
        bVar6 = iVar4 == 0;
        bVar3 = false;
      }
    }
    std::__cxx11::string::~string((string *)&local_60);
    if (!bVar3) goto LAB_0045aa8a;
  }
  bVar6 = false;
LAB_0045aa8a:
  std::__cxx11::string::~string((string *)&local_80);
  return bVar6;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}